

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

void __thiscall
opts::BasicOption::BasicOption
          (BasicOption *this,char s_,string *l_,string *default_,string *type_,string *help_)

{
  pointer pcVar1;
  
  this->_vptr_BasicOption = (_func_int **)&PTR__BasicOption_00149220;
  this->s = s_;
  (this->l)._M_dataplus._M_p = (pointer)&(this->l).field_2;
  pcVar1 = (l_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&this->l,pcVar1,pcVar1 + l_->_M_string_length)
  ;
  (this->d)._M_dataplus._M_p = (pointer)&(this->d).field_2;
  pcVar1 = (default_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->d,pcVar1,pcVar1 + default_->_M_string_length);
  (this->t)._M_dataplus._M_p = (pointer)&(this->t).field_2;
  pcVar1 = (type_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->t,pcVar1,pcVar1 + type_->_M_string_length);
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  pcVar1 = (help_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->help,pcVar1,pcVar1 + help_->_M_string_length);
  return;
}

Assistant:

BasicOption(char        s_,
                                std::string l_,
                                std::string default_,
                                std::string type_,
                                std::string help_):
                        s(s_), l(l_), d(default_), t(type_), help(help_)                    {}